

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O1

void Handler_pickupmessage_T_Inventory
               (AInventory *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  char *copyStr;
  PClass *pPVar1;
  PClass *pPVar2;
  bool bVar3;
  
  pPVar1 = PClassInventory::RegistrationInfo.MyClass;
  copyStr = params[1].s;
  if (*(PClass **)
       ((long)&(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
               super_PCompoundType.super_PType.super_PTypeBase + 8) == (PClass *)0x0) {
    pPVar2 = (PClass *)
             (*(code *)**(undefined8 **)
                         &(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                          super_PCompoundType.super_PType.super_PTypeBase)(info);
    *(PClass **)
     ((long)&(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
             super_PCompoundType.super_PType.super_PTypeBase + 8) = pPVar2;
  }
  pPVar2 = *(PClass **)
            ((long)&(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                    super_PCompoundType.super_PType.super_PTypeBase + 8);
  bVar3 = pPVar2 != (PClass *)0x0;
  if (pPVar2 != pPVar1 && bVar3) {
    do {
      pPVar2 = pPVar2->ParentClass;
      bVar3 = pPVar2 != (PClass *)0x0;
      if (pPVar2 == pPVar1) break;
    } while (pPVar2 != (PClass *)0x0);
  }
  if (bVar3) {
    FString::operator=((FString *)(info + 1),copyStr);
    return;
  }
  __assert_fail("info->IsKindOf(RUNTIME_CLASS(PClassInventory))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_properties.cpp"
                ,0x789,
                "void Handler_pickupmessage_T_Inventory(AInventory *, PClassActor *, Baggage &, FPropParam *)"
               );
}

Assistant:

DEFINE_CLASS_PROPERTY(pickupmessage, T, Inventory)
{
	PROP_STRING_PARM(str, 0);
	assert(info->IsKindOf(RUNTIME_CLASS(PClassInventory)));
	static_cast<PClassInventory *>(info)->PickupMessage = str;
}